

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O3

void build_tree_indices<ExtIsoForest>
               (TreesIndexer *indexer,ExtIsoForest *model,int nthreads,bool with_distances)

{
  pointer pSVar1;
  pointer puVar2;
  pointer pdVar3;
  iterator __begin2;
  pointer pSVar4;
  
  pSVar4 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar4 != pSVar1) &&
     ((pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    do {
      puVar2 = (pSVar4->reference_points).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      puVar2 = (pSVar4->reference_indptr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_indptr).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar4->reference_indptr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      puVar2 = (pSVar4->reference_mapping).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_mapping).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar4->reference_mapping).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar1);
  }
  if (with_distances) {
    build_distance_mappings<ExtIsoForest>(indexer,model,nthreads);
  }
  else {
    pSVar4 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((pSVar4 != pSVar1) &&
       ((pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      do {
        pdVar3 = (pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar3) {
          (pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar3;
        }
        pdVar3 = (pSVar4->node_depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((pSVar4->node_depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar3) {
          (pSVar4->node_depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar3;
        }
        pSVar4 = pSVar4 + 1;
      } while (pSVar4 != pSVar1);
    }
    build_terminal_node_mappings<ExtIsoForest>(indexer,model);
  }
  return;
}

Assistant:

void build_tree_indices(TreesIndexer &indexer, const Model &model, int nthreads, const bool with_distances)
{
    if (!indexer.indices.empty() && !indexer.indices.front().reference_points.empty())
    {
        for (auto &ind : indexer.indices)
        {
            ind.reference_points.clear();
            ind.reference_indptr.clear();
            ind.reference_mapping.clear();
        }
    }

    
    try
    {
        if (with_distances) {
            build_distance_mappings(indexer, model, nthreads);
        }

        else {
            if (!indexer.indices.empty() && !indexer.indices.front().node_distances.empty())
            {
                for (auto &ind : indexer.indices)
                {
                    ind.node_distances.clear();
                    ind.node_depths.clear();
                }
            }

            build_terminal_node_mappings(indexer, model);
        }
    }

    catch (...)
    {
        indexer.indices.clear();
        throw;
    }
}